

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O3

void __thiscall
QDataBuffer<QScanConverter::Line_*>::reserve
          (QDataBuffer<QScanConverter::Line_*> *this,qsizetype size)

{
  if (size <= this->capacity) {
    return;
  }
  QDataBuffer<QScanConverter::Line*>::reserve();
  return;
}

Assistant:

void reserve(qsizetype size) {
        if (size > capacity) {
            if (capacity == 0)
                capacity = 1;
            while (capacity < size)
                capacity *= 2;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
        }
    }